

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::ShapeFunctions
          (ChElementHexaANCF_3813_9 *this,ShapeVector *N,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  dVar1 = (this->m_dimensions).m_data[0];
  dVar2 = (this->m_dimensions).m_data[1];
  dVar3 = (this->m_dimensions).m_data[2];
  dVar4 = (1.0 - x) * 0.125;
  dVar5 = (1.0 - y) * dVar4;
  dVar8 = 1.0 - z;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[0] =
       dVar5 * dVar8;
  dVar6 = (x + 1.0) * 0.125;
  dVar7 = dVar6 * (1.0 - y);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[1] =
       dVar7 * dVar8;
  dVar6 = dVar6 * (y + 1.0);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[2] =
       dVar6 * dVar8;
  dVar4 = (y + 1.0) * dVar4;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[3] =
       dVar8 * dVar4;
  dVar8 = z + 1.0;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[4] =
       dVar5 * dVar8;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[5] =
       dVar7 * dVar8;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[6] =
       dVar6 * dVar8;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[7] =
       dVar4 * dVar8;
  dVar1 = dVar1 * dVar1;
  auVar15 = ZEXT816(0xbfc0000000000000);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = x * x * dVar1 * 0.125;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar9 = vfmadd231sd_fma(auVar9,auVar15,auVar14);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[8] =
       auVar9._0_8_;
  dVar2 = dVar2 * dVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = y * y * dVar2 * 0.125;
  auVar9 = vfmadd231sd_fma(auVar12,auVar15,auVar10);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[9] =
       auVar9._0_8_;
  dVar3 = dVar3 * dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = z * z * dVar3 * 0.125;
  auVar9 = vfmadd231sd_fma(auVar13,auVar11,auVar15);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>).m_storage.m_data.array[10] =
       auVar9._0_8_;
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::ShapeFunctions(ShapeVector& N, double x, double y, double z) {
    double a = GetDimensions().x();
    double b = GetDimensions().y();
    double c = GetDimensions().z();
    N(0) = 0.125 * (1 - x) * (1 - y) * (1 - z);
    N(1) = 0.125 * (1 + x) * (1 - y) * (1 - z);
    N(2) = 0.125 * (1 + x) * (1 + y) * (1 - z);
    N(3) = 0.125 * (1 - x) * (1 + y) * (1 - z);
    N(4) = 0.125 * (1 - x) * (1 - y) * (1 + z);
    N(5) = 0.125 * (1 + x) * (1 - y) * (1 + z);
    N(6) = 0.125 * (1 + x) * (1 + y) * (1 + z);
    N(7) = 0.125 * (1 - x) * (1 + y) * (1 + z);
    N(8) = (a * a) * (-1.0 / 8.0) + (a * a) * (x * x) * (1.0 / 8.0);
    N(9) = (b * b) * (-1.0 / 8.0) + (b * b) * (y * y) * (1.0 / 8.0);
    N(10) = (c * c) * (-1.0 / 8.0) + (c * c) * (z * z) * (1.0 / 8.0);
}